

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

mspace create_mspace_with_base(void *base,size_t capacity,int locked)

{
  flag_t local_38;
  size_t msize;
  mstate m;
  int locked_local;
  size_t capacity_local;
  void *base_local;
  
  msize = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  if ((0x400 < capacity) && (capacity < -(mparams.page_size + 0x400))) {
    msize = (size_t)init_user_mstate((char *)base,capacity);
    (((mstate)msize)->seg).sflags = 8;
    if (locked == 0) {
      local_38 = ((mstate)msize)->mflags;
    }
    else {
      local_38 = ((mstate)msize)->mflags;
    }
    ((mstate)msize)->mflags = local_38;
  }
  return (mspace)msize;
}

Assistant:

mspace create_mspace_with_base(void* base, size_t capacity, int locked) {
  mstate m = 0;
  size_t msize;
  ensure_initialization();
  msize = pad_request(sizeof(struct malloc_state));
  if (capacity > msize + TOP_FOOT_SIZE &&
      capacity < (size_t) -(msize + TOP_FOOT_SIZE + mparams.page_size)) {
    m = init_user_mstate((char*)base, capacity);
    m->seg.sflags = EXTERN_BIT;
    set_lock(m, locked);
  }
  return (mspace)m;
}